

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void capnp::compiler::findImports
               (Reader decl,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  uint *puVar1;
  Reader exp;
  Reader exp_00;
  Reader exp_01;
  Reader exp_02;
  Reader paramList;
  Reader paramList_00;
  Reader exp_03;
  Reader decl_00;
  bool bVar2;
  Which WVar3;
  Iterator IVar4;
  Iterator IVar5;
  Iterator IVar6;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 local_4a8 [8];
  Reader nested;
  undefined1 local_468 [8];
  Iterator __end2_1;
  undefined1 local_448 [8];
  Iterator __begin2_1;
  Reader *__range2_1;
  CapTableReader *pCStack_3f8;
  void *local_3f0;
  WirePointer *pWStack_3e8;
  StructDataBitCount local_3e0;
  StructPointerCount SStack_3dc;
  undefined2 uStack_3da;
  int iStack_3d8;
  undefined4 uStack_3d4;
  undefined1 local_3d0 [8];
  Reader ann;
  undefined1 local_390 [8];
  Iterator __end2;
  undefined1 local_370 [8];
  Iterator __begin2;
  Reader *__range2;
  Reader local_2f8;
  Reader local_2c8;
  Reader local_298;
  undefined1 local_268 [8];
  Reader method;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [8];
  Reader superclass;
  undefined1 local_1c8 [8];
  Iterator __end3;
  undefined1 local_1a8 [8];
  Iterator __begin3;
  Reader local_168;
  Reader *local_138;
  Reader *__range3;
  Reader local_100;
  Reader local_d0;
  Reader local_a0;
  Reader local_70;
  Reader local_40;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *local_10;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output_local;
  
  local_10 = output;
  WVar3 = Declaration::Reader::which(&decl);
  switch(WVar3) {
  case USING:
    Declaration::Reader::getUsing(&local_70,&decl);
    Declaration::Using::Reader::getTarget(&local_40,&local_70);
    exp._reader.capTable = local_40._reader.capTable;
    exp._reader.segment = local_40._reader.segment;
    exp._reader.data = local_40._reader.data;
    exp._reader.pointers = local_40._reader.pointers;
    exp._reader.dataSize = local_40._reader.dataSize;
    exp._reader.pointerCount = local_40._reader.pointerCount;
    exp._reader._38_2_ = local_40._reader._38_2_;
    exp._reader.nestingLimit = local_40._reader.nestingLimit;
    exp._reader._44_4_ = local_40._reader._44_4_;
    findImports(exp,local_10);
    break;
  case CONST:
    Declaration::Reader::getConst(&local_d0,&decl);
    Declaration::Const::Reader::getType(&local_a0,&local_d0);
    exp_00._reader.capTable = local_a0._reader.capTable;
    exp_00._reader.segment = local_a0._reader.segment;
    exp_00._reader.data = local_a0._reader.data;
    exp_00._reader.pointers = local_a0._reader.pointers;
    exp_00._reader.dataSize = local_a0._reader.dataSize;
    exp_00._reader.pointerCount = local_a0._reader.pointerCount;
    exp_00._reader._38_2_ = local_a0._reader._38_2_;
    exp_00._reader.nestingLimit = local_a0._reader.nestingLimit;
    exp_00._reader._44_4_ = local_a0._reader._44_4_;
    findImports(exp_00,local_10);
    break;
  default:
    break;
  case FIELD:
    Declaration::Reader::getField((Reader *)&__range3,&decl);
    Declaration::Field::Reader::getType(&local_100,(Reader *)&__range3);
    exp_01._reader.capTable = local_100._reader.capTable;
    exp_01._reader.segment = local_100._reader.segment;
    exp_01._reader.data = local_100._reader.data;
    exp_01._reader.pointers = local_100._reader.pointers;
    exp_01._reader.dataSize = local_100._reader.dataSize;
    exp_01._reader.pointerCount = local_100._reader.pointerCount;
    exp_01._reader._38_2_ = local_100._reader._38_2_;
    exp_01._reader.nestingLimit = local_100._reader.nestingLimit;
    exp_01._reader._44_4_ = local_100._reader._44_4_;
    findImports(exp_01,local_10);
    break;
  case INTERFACE:
    Declaration::Reader::getInterface((Reader *)&__begin3.index,&decl);
    Declaration::Interface::Reader::getSuperclasses(&local_168,(Reader *)&__begin3.index);
    local_138 = &local_168;
    IVar4 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::begin(&local_168);
    __end3._8_8_ = IVar4.container;
    __begin3.container._0_4_ = IVar4.index;
    local_1a8 = (undefined1  [8])__end3._8_8_;
    IVar4 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::end(local_138);
    superclass._reader._40_8_ = IVar4.container;
    __end3.container._0_4_ = IVar4.index;
    local_1c8 = (undefined1  [8])superclass._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_1a8,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_1c8), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator*((Reader *)local_208,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   *)local_1a8);
      memcpy(&method._reader.nestingLimit,local_208,0x30);
      exp_02._reader.capTable = (CapTableReader *)uStack_230;
      exp_02._reader.segment = (SegmentReader *)method._reader._40_8_;
      exp_02._reader.data = (void *)local_228;
      exp_02._reader.pointers = (WirePointer *)uStack_220;
      exp_02._reader._32_8_ = local_218;
      exp_02._reader._40_8_ = uStack_210;
      findImports(exp_02,local_10);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                    *)local_1a8);
    }
    break;
  case METHOD:
    Declaration::Reader::getMethod((Reader *)local_268,&decl);
    Declaration::Method::Reader::getParams(&local_298,(Reader *)local_268);
    paramList._reader.capTable = local_298._reader.capTable;
    paramList._reader.segment = local_298._reader.segment;
    paramList._reader.data = local_298._reader.data;
    paramList._reader.pointers = local_298._reader.pointers;
    paramList._reader.dataSize = local_298._reader.dataSize;
    paramList._reader.pointerCount = local_298._reader.pointerCount;
    paramList._reader._38_2_ = local_298._reader._38_2_;
    paramList._reader.nestingLimit = local_298._reader.nestingLimit;
    paramList._reader._44_4_ = local_298._reader._44_4_;
    findImports(paramList,local_10);
    Declaration::Method::Reader::getResults(&local_2c8,(Reader *)local_268);
    bVar2 = Declaration::Method::Results::Reader::isExplicit(&local_2c8);
    if (bVar2) {
      Declaration::Method::Reader::getResults((Reader *)&__range2,(Reader *)local_268);
      Declaration::Method::Results::Reader::getExplicit(&local_2f8,(Reader *)&__range2);
      paramList_00._reader.capTable = local_2f8._reader.capTable;
      paramList_00._reader.segment = local_2f8._reader.segment;
      paramList_00._reader.data = local_2f8._reader.data;
      paramList_00._reader.pointers = local_2f8._reader.pointers;
      paramList_00._reader.dataSize = local_2f8._reader.dataSize;
      paramList_00._reader.pointerCount = local_2f8._reader.pointerCount;
      paramList_00._reader._38_2_ = local_2f8._reader._38_2_;
      paramList_00._reader.nestingLimit = local_2f8._reader.nestingLimit;
      paramList_00._reader._44_4_ = local_2f8._reader._44_4_;
      findImports(paramList_00,local_10);
    }
  }
  puVar1 = &__begin2.index;
  Declaration::Reader::getAnnotations((Reader *)puVar1,&decl);
  IVar5 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)puVar1);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_370 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::end
                    ((Reader *)puVar1);
  ann._reader._40_8_ = IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  local_390 = (undefined1  [8])ann._reader._40_8_;
  while (bVar2 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                               *)local_370,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                               *)local_390), ((bVar2 ^ 0xffU) & 1) != 0) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
    ::operator*((Reader *)local_3d0,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                 *)local_370);
    Declaration::AnnotationApplication::Reader::getName((Reader *)&__range2_1,(Reader *)local_3d0);
    exp_03._reader.capTable = pCStack_3f8;
    exp_03._reader.segment = (SegmentReader *)__range2_1;
    exp_03._reader.data = local_3f0;
    exp_03._reader.pointers = pWStack_3e8;
    exp_03._reader.dataSize = local_3e0;
    exp_03._reader.pointerCount = SStack_3dc;
    exp_03._reader._38_2_ = uStack_3da;
    exp_03._reader.nestingLimit = iStack_3d8;
    exp_03._reader._44_4_ = uStack_3d4;
    findImports(exp_03,local_10);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::AnnotationApplication::Reader>
                  *)local_370);
  }
  puVar1 = &__begin2_1.index;
  Declaration::Reader::getNestedDecls((Reader *)puVar1,&decl);
  IVar6 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
  __end2_1._8_8_ = IVar6.container;
  __begin2_1.container._0_4_ = IVar6.index;
  local_448 = (undefined1  [8])__end2_1._8_8_;
  IVar6 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
  nested._reader._40_8_ = IVar6.container;
  __end2_1.container._0_4_ = IVar6.index;
  local_468 = (undefined1  [8])nested._reader._40_8_;
  while (bVar2 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_448,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_468), ((bVar2 ^ 0xffU) & 1) != 0) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)local_4a8,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_448);
    memcpy(&local_4d8,local_4a8,0x30);
    decl_00._reader.capTable = (CapTableReader *)uStack_4d0;
    decl_00._reader.segment = (SegmentReader *)local_4d8;
    decl_00._reader.data = (void *)local_4c8;
    decl_00._reader.pointers = (WirePointer *)uStack_4c0;
    decl_00._reader.dataSize = (undefined4)local_4b8;
    decl_00._reader.pointerCount = local_4b8._4_2_;
    decl_00._reader._38_2_ = local_4b8._6_2_;
    decl_00._reader._40_8_ = uStack_4b0;
    findImports(decl_00,local_10);
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_448);
  }
  return;
}

Assistant:

static void findImports(Declaration::Reader decl, std::set<kj::StringPtr>& output) {
  switch (decl.which()) {
    case Declaration::USING:
      findImports(decl.getUsing().getTarget(), output);
      break;
    case Declaration::CONST:
      findImports(decl.getConst().getType(), output);
      break;
    case Declaration::FIELD:
      findImports(decl.getField().getType(), output);
      break;
    case Declaration::INTERFACE:
      for (auto superclass: decl.getInterface().getSuperclasses()) {
        findImports(superclass, output);
      }
      break;
    case Declaration::METHOD: {
      auto method = decl.getMethod();

      findImports(method.getParams(), output);
      if (method.getResults().isExplicit()) {
        findImports(method.getResults().getExplicit(), output);
      }
      break;
    }
    default:
      break;
  }

  for (auto ann: decl.getAnnotations()) {
    findImports(ann.getName(), output);
  }

  for (auto nested: decl.getNestedDecls()) {
    findImports(nested, output);
  }
}